

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.hpp
# Opt level: O0

fvar<float,_2UL> __thiscall
ising::free_energy::triangular::anon_unknown_4::
functor<float,_boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>_>::operator()
          (functor<float,_boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>_>
           *this,float t1,float t2)

{
  root_type *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  array<float,_3UL> aVar1;
  root_type *ca;
  fvar<float,_2UL> *in_stack_fffffffffffffeb0;
  fvar<float,_2UL> *this_00;
  fvar<float,_2UL> *cr;
  fvar<float,_2UL> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  
  ca = in_RDI + 10;
  std::cos((double)(ulong)(uint)in_XMM0_Da);
  boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>::operator*
            (in_stack_fffffffffffffeb0,ca);
  boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>::operator-
            ((fvar<float,_2UL> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  this_00 = (fvar<float,_2UL> *)(in_RDI + 4);
  std::cos((double)(ulong)(uint)in_XMM1_Da);
  boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>::operator*(this_00,ca);
  boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>::operator-
            ((fvar<float,_2UL> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  cr = (fvar<float,_2UL> *)(in_RDI + 7);
  std::cos((double)(ulong)(uint)(in_XMM0_Da + in_XMM1_Da));
  boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>::operator*(this_00,ca);
  boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>::operator-
            ((fvar<float,_2UL> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  boost::math::differentiation::autodiff_v1::detail::log<float,2ul>
            ((fvar<float,_2UL> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  aVar1._M_elems = (_Type)boost::math::differentiation::autodiff_v1::detail::operator*(in_RDI,cr);
  return (array<float,_3UL>)(array<float,_3UL>)aVar1._M_elems;
}

Assistant:

FVAR operator()(T t1, T t2) const {
    using std::cos;
    using std::log;
    return c_ * log(cshabc_ - sh2a_ * cos(t1) - sh2b_ * cos(t2) -
                    sh2c_ * cos(t1 + t2));
  }